

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

string * trim(string *s)

{
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_RSI;
  string *in_RDI;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *unaff_retaddr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000008;
  regex e;
  string *this;
  flag_type in_stack_ffffffffffffffe4;
  char *in_stack_ffffffffffffffe8;
  string *__fmt;
  
  this = in_RDI;
  __fmt = in_RDI;
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (in_RSI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4);
  std::
  regex_replace<std::__cxx11::regex_traits<char>,char,std::char_traits<char>,std::allocator<char>>
            (in_stack_00000008,unaff_retaddr,(char *)__fmt,(match_flag_type)((ulong)in_RSI >> 0x20))
  ;
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)this);
  return in_RDI;
}

Assistant:

std::string trim(const std::string & s) {
    std::regex e("^\\s+|\\s+$");
    return std::regex_replace(s, e, "");
}